

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinter.cpp
# Opt level: O3

void __thiscall QPrinter::setOutputFormat(QPrinter *this,OutputFormat format)

{
  QPrinterPrivate *this_00;
  bool bVar1;
  undefined4 in_register_00000034;
  QPrinterInfo *printer;
  long in_FS_OFFSET;
  QPrinterInfo printerToUse;
  QPrinterInfo QStack_38;
  QScopedPointer<QPrinterInfoPrivate,_QPrinterInfoPrivateDeleter> local_30;
  long local_28;
  
  printer = (QPrinterInfo *)CONCAT44(in_register_00000034,format);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if (this_00->outputFormat != format) {
    if (format == NativeFormat) {
      local_30.d = (QPrinterInfoPrivate *)0xaaaaaaaaaaaaaaaa;
      QPrinterInfo::QPrinterInfo(&QStack_38);
      QPrinterPrivate::findValidPrinter((QPrinterPrivate *)&stack0xffffffffffffffd0,printer);
      QPrinterInfo::~QPrinterInfo(&QStack_38);
      bVar1 = QPrinterInfo::isNull((QPrinterInfo *)&stack0xffffffffffffffd0);
      if (!bVar1) {
        QPrinterPrivate::changeEngines
                  (this_00,NativeFormat,(QPrinterInfo *)&stack0xffffffffffffffd0);
      }
    }
    else {
      QPrinterInfo::QPrinterInfo((QPrinterInfo *)&stack0xffffffffffffffd0);
      QPrinterPrivate::changeEngines(this_00,format,(QPrinterInfo *)&stack0xffffffffffffffd0);
    }
    QPrinterInfo::~QPrinterInfo((QPrinterInfo *)&stack0xffffffffffffffd0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPrinter::setOutputFormat(OutputFormat format)
{
    Q_D(QPrinter);

    if (d->outputFormat == format)
        return;

    if (format == QPrinter::NativeFormat) {
        QPrinterInfo printerToUse = d->findValidPrinter();
        if (!printerToUse.isNull())
            d->changeEngines(format, printerToUse);
    } else {
        d->changeEngines(format, QPrinterInfo());
    }
}